

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O1

void __thiscall Nibbler::getRemainder(Nibbler *this,string *result)

{
  long *local_30 [2];
  long local_20 [2];
  
  if (this->_cursor < this->_length) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)this);
    std::__cxx11::string::operator=((string *)result,(string *)local_30);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return;
}

Assistant:

void Nibbler::getRemainder (std::string& result)
{
  if (_cursor < _length)
    result = _input.substr (_cursor);
}